

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

int detectSwitch(istream *in)

{
  value_type_conflict2 vVar1;
  streamoff sVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *this;
  char *in_RDI;
  little_int32_buf_t buf [2];
  int size;
  path *in_stack_00000048;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000050;
  undefined1 local_30 [8];
  fpos local_28 [20];
  int local_14;
  char *local_10;
  value_type_conflict2 local_4;
  
  local_10 = in_RDI;
  std::istream::seekg((long)in_RDI,_S_beg);
  local_28._0_16_ = std::istream::tellg();
  sVar2 = std::fpos::operator_cast_to_long(local_28);
  local_14 = (int)sVar2;
  std::istream::seekg((long)local_10,4);
  std::istream::read(local_10,(long)local_30);
  std::istream::seekg((long)local_10,_S_beg);
  vVar1 = boost::endian::endian_buffer<(boost::endian::order)1,_int,_32UL,_(boost::endian::align)0>
          ::value((endian_buffer<(boost::endian::order)1,_int,_32UL,_(boost::endian::align)0> *)
                  0x116881);
  if (vVar1 == local_14) {
    local_4 = boost::endian::
              endian_buffer<(boost::endian::order)1,_int,_32UL,_(boost::endian::align)0>::value
                        ((endian_buffer<(boost::endian::order)1,_int,_32UL,_(boost::endian::align)0>
                          *)0x116891);
  }
  else {
    vVar1 = boost::endian::
            endian_buffer<(boost::endian::order)1,_int,_32UL,_(boost::endian::align)0>::value
                      ((endian_buffer<(boost::endian::order)1,_int,_32UL,_(boost::endian::align)0> *
                       )0x1168a1);
    if (vVar1 != local_14) {
      std::operator<<((ostream *)&std::cerr,"Failed to autodetect file type of ");
      pbVar3 = std::filesystem::__cxx11::operator<<(in_stack_00000050,in_stack_00000048);
      this = std::operator<<(pbVar3,", guessing PS3");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int detectSwitch(std::istream &in) {
	in.seekg(0, in.end);
	int size = in.tellg();
	in.seekg(4, in.beg);
	boost::endian::little_int32_buf_t buf[2];
	in.read((char *)buf, sizeof(buf));
	in.seekg(0, in.beg);
	if (buf[1].value() == size) {
		return buf[0].value();
	}
	else {
		if (buf[0].value() != size) {
			std::cerr << "Failed to autodetect file type of " << currentFileName << ", guessing PS3" << std::endl;
		}
		return -1;
	}
}